

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O1

void singleOptionHelp(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  ushort **ppuVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  void *pvVar12;
  byte *pbVar13;
  uint uVar14;
  float fVar15;
  double *pdVar16;
  poptOption *opt_00;
  long lVar17;
  char *pcVar18;
  char *__src;
  FILE *__s;
  size_t sVar19;
  ulong uVar20;
  byte *pbVar21;
  byte *__s_00;
  bool bVar22;
  double dVar23;
  mbstate_t t;
  mbstate_t mStack_c8;
  char *pcStack_c0;
  byte *pbStack_b8;
  ulong uStack_b0;
  byte *pbStack_a8;
  byte *pbStack_a0;
  ushort **ppuStack_98;
  code *pcStack_90;
  byte *local_88;
  char *local_80;
  byte *local_78;
  poptOption *local_70;
  char *local_68;
  size_t local_60;
  FILE *local_58;
  size_t local_50;
  byte *local_48;
  char *local_40;
  mbstate_t local_38;
  
  sVar3 = columns->cur;
  local_60 = columns->max;
  __s_00 = (byte *)opt->descrip;
  pcStack_90 = (code *)0x106e7b;
  local_58 = (FILE *)fp;
  local_68 = getArgDescrip(opt,(char *)columns);
  pcStack_90 = (code *)0x106e85;
  ppuVar7 = __ctype_b_loc();
  local_78 = (byte *)(long)opt->shortName;
  local_88 = (byte *)CONCAT71(local_88._1_7_,local_78 != (byte *)0x20);
  bVar4 = *(byte *)((long)*ppuVar7 + (long)local_78 * 2 + 1);
  sVar19 = sVar3 + 1;
  pcVar18 = opt->longName;
  local_50 = sVar3;
  if (pcVar18 != (char *)0x0) {
    pcStack_90 = (code *)0x106ebf;
    sVar8 = strlen(pcVar18);
    sVar19 = sVar19 + sVar8;
  }
  local_80 = (char *)CONCAT44(local_80._4_4_,opt->argInfo);
  sVar8 = sVar19 + 4;
  if ((opt->argInfo >> 0x15 & 1) == 0) {
    sVar8 = sVar19;
  }
  local_70 = opt;
  if (local_68 != (char *)0x0) {
    pcStack_90 = (code *)0x106ee9;
    sVar19 = strlen(local_68);
    sVar8 = sVar8 + sVar19;
  }
  sVar3 = local_60;
  pcStack_90 = (code *)0x106ef9;
  pcVar9 = (char *)malloc(sVar8);
  if (pcVar9 == (char *)0x0) {
    return;
  }
  *pcVar9 = '\0';
  pcVar9[local_50] = '\0';
  bVar4 = (byte)local_88 & (bVar4 & 0x40) >> 6;
  if (bVar4 == 0) {
    if (pcVar18 == (char *)0x0) {
      pbVar13 = (byte *)0x0;
      goto LAB_00107565;
    }
    pcVar10 = "-";
    if (-1 < (int)(uint)local_80) {
      pcVar10 = "--";
    }
    __src = "";
    if ((_poptArgMask & (uint)local_80) == 0x1b) {
      pcVar10 = "";
    }
    if (((((uint)local_80 >> 0x15 & 1) != 0) && (__src = "[no]", *pcVar18 == 'n')) &&
       (pcVar18[1] == 'o')) {
      pcVar1 = pcVar18 + 3;
      pcVar2 = pcVar18 + 2;
      pcVar18 = pcVar18 + 2;
      if (*pcVar2 == '-') {
        pcVar18 = pcVar1;
      }
    }
    builtin_strncpy(pcVar9,"    ",5);
    pcStack_90 = (code *)0x106fdb;
    pcVar10 = stpcpy(pcVar9 + 4,pcVar10);
LAB_00106fe4:
    pcStack_90 = (code *)0x106fe9;
    pcVar10 = stpcpy(pcVar10,__src);
    pcStack_90 = (code *)0x106ff4;
    strcpy(pcVar10,pcVar18);
  }
  else {
    if (pcVar18 != (char *)0x0) {
      __src = "-";
      if (-1 < (int)(uint)local_80) {
        __src = "--";
      }
      *pcVar9 = '-';
      pcVar9[1] = (char)local_78;
      pcVar10 = pcVar9 + 4;
      pcVar9[2] = ',';
      pcVar9[3] = ' ';
      pcVar9[4] = '\0';
      goto LAB_00106fe4;
    }
    if (bVar4 != 0) {
      *pcVar9 = '-';
      pcVar9[1] = (char)local_78;
      pcVar9[2] = '\0';
    }
  }
  local_60 = local_50 + 5;
  uVar20 = sVar3 - local_60;
  if (local_68 == (char *)0x0) {
    iVar6 = 0;
    pbVar13 = (byte *)0x0;
    goto LAB_001073d0;
  }
  pcStack_90 = (code *)0x107015;
  sVar19 = strlen(pcVar9);
  pcVar18 = pcVar9 + sVar19;
  uVar14 = local_70->argInfo;
  if ((uVar14 >> 0x1c & 1) != 0) {
    *pcVar18 = '[';
    pcVar18 = pcVar18 + 1;
  }
  local_80 = pcVar9;
  if ((uVar14 >> 0x17 & 1) == 0) {
    local_88 = (byte *)0x0;
    pbVar13 = local_88;
    goto LAB_001072b3;
  }
  pcStack_90 = (code *)0x107064;
  pbVar13 = (byte *)malloc(uVar20 * 4 + 1);
  if (pbVar13 == (byte *)0x0) goto LAB_00107220;
  *pbVar13 = 0x28;
  pbVar13[1] = 100;
  pbVar13[2] = 0x65;
  pbVar13[3] = 0x66;
  pbVar13[4] = 0x61;
  pbVar13[5] = 0x75;
  pbVar13[6] = 0x6c;
  pbVar13[7] = 0x74;
  pbVar13[8] = 0;
  pbVar13[8] = 0x3a;
  pbVar21 = pbVar13 + 10;
  pbVar13[9] = 0x20;
  pdVar16 = (double *)local_70->arg;
  if (pdVar16 == (double *)0x0) goto LAB_00107219;
  switch(uVar14 & _poptArgMask) {
  case 1:
    pcVar9 = (char *)*pdVar16;
    if (pcVar9 != (char *)0x0) {
      local_88 = (byte *)(uVar20 * 4);
      local_48 = local_88 + -0xe;
      local_78 = pbVar13 + 0xb;
      pbVar13[10] = 0x22;
      pcStack_90 = (code *)0x1071b9;
      strncpy((char *)local_78,pcVar9,(size_t)local_48);
      (pbVar13 + -3)[(long)local_88] = 0;
      pcStack_90 = (code *)0x1071cd;
      pbVar11 = (byte *)strlen((char *)local_78);
      pbVar21 = pbVar13 + (long)pbVar11;
      if ((pbVar11 == local_48) && (pcVar9[(long)local_48] != '\0')) {
        pbVar21[8] = 0x2e;
        pbVar21[9] = 0x2e;
        pbVar21[10] = 0x2e;
      }
      pbVar21[0xb] = 0x22;
      pbVar21 = pbVar21 + 0xc;
      goto LAB_00107213;
    }
    pbVar13[0xe] = 0;
    pbVar21[0] = 0x6e;
    pbVar21[1] = 0x75;
    pbVar21[2] = 0x6c;
    pbVar21[3] = 0x6c;
    pbVar21 = pbVar13 + 0xe;
    bVar22 = true;
    goto LAB_00107215;
  case 2:
  case 7:
    fVar15 = *(float *)pdVar16;
    pcVar9 = "%d";
    goto LAB_00107138;
  case 3:
    pdVar16 = (double *)*pdVar16;
    pcVar9 = "%ld";
    break;
  case 4:
  case 5:
  case 6:
  case 0xb:
    goto switchD_001070c4_caseD_4;
  case 8:
    dVar23 = (double)*(float *)pdVar16;
    goto LAB_0010714b;
  case 9:
    dVar23 = *pdVar16;
LAB_0010714b:
    bVar22 = true;
    pcStack_90 = (code *)0x107163;
    local_88 = pbVar21;
    iVar6 = sprintf((char *)pbVar21,"%g",dVar23);
    pbVar21 = local_88 + iVar6;
    goto LAB_00107215;
  case 10:
    pdVar16 = (double *)*pdVar16;
    pcVar9 = "%lld";
    break;
  case 0xc:
switchD_001070c4_caseD_c:
    pcVar9 = "%p";
    break;
  case 0xd:
    fVar15 = (float)(int)*(short *)pdVar16;
    pcVar9 = "%hd";
LAB_00107138:
    pcStack_90 = (code *)0x107142;
    iVar6 = sprintf((char *)pbVar21,pcVar9,(ulong)(uint)fVar15);
    goto LAB_0010720b;
  default:
    if ((uVar14 & _poptArgMask) == 0x1b) goto switchD_001070c4_caseD_c;
    goto switchD_001070c4_caseD_4;
  }
  pcStack_90 = (code *)0x10720b;
  iVar6 = sprintf((char *)pbVar21,pcVar9,pdVar16);
LAB_0010720b:
  pbVar21 = pbVar21 + iVar6;
LAB_00107213:
  bVar22 = true;
LAB_00107215:
  if (bVar22) {
LAB_00107219:
    pbVar21[0] = 0x29;
    pbVar21[1] = 0;
  }
  else {
LAB_00107220:
    pbVar13 = (byte *)0x0;
  }
  if (pbVar13 == (byte *)0x0) {
    local_88 = (byte *)0x0;
    pcVar9 = local_80;
    pbVar13 = local_88;
  }
  else {
    if (__s_00 == (byte *)0x0) {
      lVar17 = 2;
    }
    else {
      pcStack_90 = (code *)0x10723a;
      sVar19 = strlen((char *)__s_00);
      lVar17 = sVar19 + 2;
    }
    pcStack_90 = (code *)0x10725a;
    sVar19 = strlen((char *)pbVar13);
    pcStack_90 = (code *)0x107265;
    pbVar21 = (byte *)malloc(lVar17 + sVar19);
    pcVar9 = local_80;
    if (pbVar21 != (byte *)0x0) {
      pbVar11 = pbVar21;
      local_78 = pbVar13;
      if (__s_00 != (byte *)0x0) {
        pcStack_90 = (code *)0x107291;
        pbVar11 = (byte *)stpcpy((char *)pbVar21,(char *)__s_00);
      }
      pbVar13 = local_78;
      *pbVar11 = 0x20;
      pcStack_90 = (code *)0x1072ab;
      local_88 = pbVar21;
      strcpy((char *)(pbVar11 + 1),(char *)local_78);
      pcStack_90 = (code *)0x1072b3;
      free(pbVar13);
      pbVar13 = local_88;
    }
  }
LAB_001072b3:
  local_88 = pbVar13;
  if (local_70->argDescrip == (char *)0x0) {
    uVar14 = _poptArgMask & local_70->argInfo;
    iVar6 = 0;
    if ((uVar14 < 0xe) && ((0x270eU >> (uVar14 & 0x1f) & 1) != 0)) {
      cVar5 = '=';
      if (local_70->longName == (char *)0x0) {
        cVar5 = ' ';
      }
      *pcVar18 = cVar5;
      pcStack_90 = (code *)0x1073b1;
      pcVar18 = stpcpy(pcVar18 + 1,local_68);
      iVar6 = 0;
    }
  }
  else {
    pcStack_90 = (code *)0x1072dc;
    pvVar12 = memchr(" =(",(int)*local_68,4);
    local_40 = local_68;
    pcVar9 = pcVar18;
    if (pvVar12 == (void *)0x0) {
      uVar14 = _poptArgMask & local_70->argInfo;
      cVar5 = ' ';
      if (((uVar14 != 0xc) && (uVar14 != 0x1b)) && (cVar5 = '=', local_70->longName == (char *)0x0))
      {
        cVar5 = ' ';
      }
      *pcVar18 = cVar5;
      pcVar9 = pcVar18 + 1;
    }
    pcStack_90 = (code *)0x107328;
    pcVar18 = stpcpy(pcVar9,local_68);
    pcStack_90 = (code *)0x10733b;
    sVar19 = strlen(local_40);
    local_38.__count = 0;
    local_38.__value = (_union_27)0x0;
    pcStack_90 = (code *)0x107356;
    sVar19 = mbsrtowcs((wchar_t *)0x0,&local_40,sVar19,&local_38);
    iVar6 = (int)pcVar18 - ((int)pcVar9 + (int)sVar19);
    pcVar9 = local_80;
  }
  if ((local_70->argInfo & 0x10000000) != 0) {
    *pcVar18 = ']';
    pcVar18 = pcVar18 + 1;
  }
  *pcVar18 = '\0';
  pbVar13 = local_88;
LAB_001073d0:
  if (__s_00 == (byte *)0x0) {
    pcStack_90 = (code *)0x10753b;
    POPT_fprintf((FILE *)local_58,"  %s\n",pcVar9);
  }
  else {
    pcVar18 = "  %-*s   ";
    pcStack_90 = (code *)0x1073f3;
    POPT_fprintf((FILE *)local_58,"  %-*s   ",(ulong)(uint)(iVar6 + (int)local_50),pcVar9);
    pcStack_90 = (code *)0x1073fb;
    free(pcVar9);
    if (pbVar13 != (byte *)0x0) {
      __s_00 = pbVar13;
    }
    pcStack_90 = (code *)0x10740e;
    local_88 = pbVar13;
    sVar19 = strlen((char *)__s_00);
    do {
      pbVar13 = __s_00;
      if (sVar19 <= uVar20) break;
      pbVar21 = __s_00 + (uVar20 - 1);
      while ((__s_00 < pbVar21 &&
             ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar21 * 2 + 1) & 0x20) == 0))) {
        pcStack_90 = (code *)0x10743f;
        pbVar21 = (byte *)POPT_prev_char((char *)pbVar21);
      }
      if (pbVar21 != __s_00) {
        pbVar13 = pbVar21;
        while ((__s_00 + 1 < pbVar13 &&
               ((*(byte *)((long)*ppuVar7 + (ulong)*pbVar13 * 2 + 1) & 0x20) != 0))) {
          pcStack_90 = (code *)0x107477;
          pbVar13 = (byte *)POPT_prev_char((char *)pbVar13);
        }
        pcStack_90 = (code *)0x107484;
        pbVar13 = (byte *)POPT_next_char((char *)pbVar13);
        pcStack_90 = (code *)0x10748f;
        sVar19 = strlen((char *)__s_00);
        __s = (FILE *)(sVar19 + 1);
        pcStack_90 = (code *)0x107498;
        pcVar9 = (char *)malloc((size_t)__s);
        if (pcVar9 == (char *)0x0) {
          pcStack_90 = singleOptionUsage;
          singleOptionHelp_cold_1();
          pbStack_b8 = __s_00 + 1;
          uStack_b0 = uVar20;
          pbStack_a8 = pbVar21;
          pbStack_a0 = __s_00;
          ppuStack_98 = ppuVar7;
          pcStack_90 = (code *)pbVar13;
          pcVar9 = getArgDescrip(opt_00,pcVar18);
          ppuVar7 = __ctype_b_loc();
          lVar17 = 5;
          bVar4 = (*(byte *)((long)*ppuVar7 + (long)opt_00->shortName * 2 + 1) & 0x40) >> 6 &
                  (long)opt_00->shortName != 0x20;
          if ((bVar4 != 0) || (lVar17 = 3, opt_00->longName != (char *)0x0)) {
            if (opt_00->longName != (char *)0x0) {
              uVar14 = opt_00->argInfo;
              sVar19 = strlen(opt_00->longName);
              lVar17 = lVar17 + sVar19 + (ulong)bVar4 + (ulong)(-1 < (int)uVar14) + 1;
            }
            if (pcVar9 != (char *)0x0) {
              pvVar12 = memchr(" =(",(int)*pcVar9,4);
              pcStack_c0 = pcVar9;
              sVar19 = strlen(pcVar9);
              mStack_c8.__count = 0;
              mStack_c8.__value = (_union_27)0x0;
              sVar19 = mbsrtowcs((wchar_t *)0x0,&pcStack_c0,sVar19,&mStack_c8);
              lVar17 = lVar17 + sVar19 + (ulong)(pvVar12 == (void *)0x0);
            }
            if (*(ulong *)((long)pcVar18 + 8) < (ulong)(*(long *)pcVar18 + lVar17)) {
              fwrite("\n       ",8,1,__s);
              *(long *)pcVar18 = 7;
            }
            fwrite(" [",2,1,__s);
            if (bVar4 != 0) {
              fprintf(__s,"-%c",(ulong)(uint)(int)opt_00->shortName);
            }
            if (opt_00->longName != (char *)0x0) {
              pcVar18 = "";
              if (bVar4 != 0) {
                pcVar18 = "|";
              }
              pcVar10 = "-";
              if (-1 < (int)opt_00->argInfo) {
                pcVar10 = "--";
              }
              fprintf(__s,"%s%s%s",pcVar18,pcVar10);
            }
            if (pcVar9 != (char *)0x0) {
              pvVar12 = memchr(" =(",(int)*pcVar9,4);
              if (pvVar12 == (void *)0x0) {
                iVar6 = 0x3d;
                if (opt_00->longName == (char *)0x0) {
                  iVar6 = 0x20;
                }
                fputc(iVar6,__s);
              }
              fputs(pcVar9,__s);
            }
            fputc(0x5d,__s);
          }
          return;
        }
        pcStack_90 = (code *)0x1074af;
        strcpy(pcVar9,(char *)__s_00);
        pcVar9[(long)pbVar13 - (long)__s_00] = '\0';
        pcVar18 = "%s\n%*s";
        pcStack_90 = (code *)0x1074db;
        POPT_fprintf((FILE *)local_58,"%s\n%*s",pcVar9,local_60," ");
        pcStack_90 = (code *)0x1074e3;
        free(pcVar9);
        bVar4 = *pbVar13;
        while ((bVar4 != 0 && (((*ppuVar7)[bVar4] & 0x2000) != 0))) {
          pcStack_90 = (code *)0x107501;
          pbVar13 = (byte *)POPT_next_char((char *)pbVar13);
          bVar4 = *pbVar13;
        }
        pcStack_90 = (code *)0x107511;
        sVar19 = strlen((char *)pbVar13);
      }
      bVar22 = pbVar21 != __s_00;
      __s_00 = pbVar13;
    } while (bVar22);
    if (sVar19 != 0) {
      pcStack_90 = (code *)0x10755d;
      fprintf(local_58,"%s\n",pbVar13);
    }
    pcVar9 = (char *)0x0;
    pbVar13 = local_88;
  }
LAB_00107565:
  if (pbVar13 != (byte *)0x0) {
    pcStack_90 = (code *)0x107572;
    free(pbVar13);
  }
  if (pcVar9 != (char *)0x0) {
    pcStack_90 = (code *)0x10757f;
    free(pcVar9);
  }
  return;
switchD_001070c4_caseD_4:
  pcStack_90 = (code *)0x10711b;
  free(pbVar13);
  bVar22 = false;
  pbVar13 = (byte *)0x0;
  goto LAB_00107215;
}

Assistant:

static void singleOptionHelp(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char * translation_domain)
{
    size_t maxLeftCol = columns->cur;
    size_t indentLength = maxLeftCol + 5;
    size_t lineLength = columns->max - indentLength;
    const char * help = D_(translation_domain, opt->descrip);
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');
    size_t helpLength;
    char * defs = NULL;
    char * left;
    size_t nb = maxLeftCol + 1;
    int displaypad = 0;

    /* Make sure there's more than enough room in target buffer. */
    if (opt->longName)	nb += strlen(opt->longName);
    if (F_ISSET(opt, TOGGLE)) nb += sizeof("[no]") - 1;
    if (argDescrip)	nb += strlen(argDescrip);

    left = malloc(nb);
    if (left == NULL) return;	/* XXX can't happen */
    left[0] = '\0';
    left[maxLeftCol] = '\0';

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	goto out;
    if (prtshort && prtlong) {
	const char *dash = F_ISSET(opt, ONEDASH) ? "-" : "--";
	left[0] = '-';
	left[1] = opt->shortName;
	(void) stpcpy(stpcpy(stpcpy(left+2, ", "), dash), opt->longName);
    } else if (prtshort) {
	left[0] = '-';
	left[1] = opt->shortName;
	left[2] = '\0';
    } else if (prtlong) {
	/* XXX --long always padded for alignment with/without "-X, ". */
	const char *dash = poptArgType(opt) == POPT_ARG_MAINCALL ? ""
			 : (F_ISSET(opt, ONEDASH) ? "-" : "--");
	const char *longName = opt->longName;
	const char *toggle;
	if (F_ISSET(opt, TOGGLE)) {
	    toggle = "[no]";
	    if (longName[0] == 'n' && longName[1] == 'o') {
		longName += sizeof("no") - 1;
		if (longName[0] == '-')
		    longName++;
	    }
	} else
	    toggle = "";
	(void) stpcpy(stpcpy(stpcpy(stpcpy(left, "    "), dash), toggle), longName);
    }
#undef	prtlong

    if (argDescrip) {
	char * le = left + strlen(left);

	if (F_ISSET(opt, OPTIONAL))
	    *le++ = '[';

	/* Choose type of output */
	if (F_ISSET(opt, SHOW_DEFAULT)) {
	    defs = singleOptionDefaultValue(lineLength, opt, translation_domain);
	    if (defs) {
		char * t = malloc((help ? strlen(help) : 0) +
				strlen(defs) + sizeof(" "));
		if (t) {
		    char * te = t;
		    if (help)
			te = stpcpy(te, help);
		    *te++ = ' ';
		    strcpy(te, defs);
		    defs = _free(defs);
		    defs = t;
		}
	    }
	}

	if (opt->argDescrip == NULL) {
	    switch (poptArgType(opt)) {
	    case POPT_ARG_NONE:
		break;
	    case POPT_ARG_VAL:
#ifdef	NOTNOW	/* XXX pug ugly nerdy output */
	    {	long aLong = opt->val;
		int ops = F_ISSET(opt, LOGICALOPS);
		int negate = F_ISSET(opt, NOT);

		/* Don't bother displaying typical values */
		if (!ops && (aLong == 0L || aLong == 1L || aLong == -1L))
		    break;
		*le++ = '[';
		switch (ops) {
		case POPT_ARGFLAG_OR:
		    *le++ = '|';
		    break;
		case POPT_ARGFLAG_AND:
		    *le++ = '&';
		    break;
		case POPT_ARGFLAG_XOR:
		    *le++ = '^';
		    break;
		default:
		    break;
		}
		*le++ = (opt->longName != NULL ? '=' : ' ');
		if (negate) *le++ = '~';
		le += sprintf(le, (ops ? "0x%lx" : "%ld"), aLong);
		*le++ = ']';
	    }
#endif
		break;
	    case POPT_ARG_INT:
	    case POPT_ARG_SHORT:
	    case POPT_ARG_LONG:
	    case POPT_ARG_LONGLONG:
	    case POPT_ARG_FLOAT:
	    case POPT_ARG_DOUBLE:
	    case POPT_ARG_STRING:
		*le++ = (opt->longName != NULL ? '=' : ' ');
		le = stpcpy(le, argDescrip);
		break;
	    default:
		break;
	    }
	} else {
	    char *leo;

	    /* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	    if (!strchr(" =(", argDescrip[0]))
		*le++ = ((poptArgType(opt) == POPT_ARG_MAINCALL) ? ' ' :
			 (poptArgType(opt) == POPT_ARG_ARGV) ? ' ' :
			 opt->longName == NULL ? ' ' : '=');
	    le = stpcpy(leo = le, argDescrip);

	    /* Adjust for (possible) wide characters. */
	    displaypad = (int)((le - leo) - stringDisplayWidth(argDescrip));
	}
	if (F_ISSET(opt, OPTIONAL))
	    *le++ = ']';
	*le = '\0';
    }

    if (help)
	POPT_fprintf(fp,"  %-*s   ", (int)(maxLeftCol+displaypad), left);
    else {
	POPT_fprintf(fp,"  %s\n", left);
	goto out;
    }

    left = _free(left);
    if (defs)
	help = defs;

    helpLength = strlen(help);
    while (helpLength > lineLength) {
	const char * ch;

	ch = help + lineLength - 1;
	while (ch > help && !_isspaceptr(ch))
	    ch = POPT_prev_char(ch);
	if (ch == help) break;		/* give up */
	while (ch > (help + 1) && _isspaceptr(ch))
	    ch = POPT_prev_char (ch);
	ch = POPT_next_char(ch);

	/*
	 *  XXX strdup is necessary to add NUL terminator so that an unknown
	 *  no. of (possible) multi-byte characters can be displayed.
	 */
	{   char * fmthelp = xstrdup(help);
	    if (fmthelp) {
		fmthelp[ch - help] = '\0';
		POPT_fprintf(fp, "%s\n%*s", fmthelp, (int) indentLength, " ");
		free(fmthelp);
	    }
	}

	help = ch;
	while (_isspaceptr(help) && *help)
	    help = POPT_next_char(help);
	helpLength = strlen(help);
    }

    if (helpLength) fprintf(fp, "%s\n", help);
    help = NULL;

out:
    defs = _free(defs);
    left = _free(left);
}